

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O0

void __thiscall
booster::locale::gnu_gettext::mo_file::load_file
          (mo_file *this,vector<char,_std::allocator<char>_> *data)

{
  size_type sVar1;
  reference pvVar2;
  runtime_error *this_00;
  undefined8 uVar3;
  long in_RDI;
  uint32_t magic;
  string *in_stack_ffffffffffffff68;
  string *s;
  runtime_error *in_stack_ffffffffffffff70;
  undefined1 local_71 [37];
  int local_4c;
  undefined1 local_45;
  allocator local_31;
  string local_30 [48];
  
  std::vector<char,_std::allocator<char>_>::swap
            ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff70,
             (vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff68);
  sVar1 = std::vector<char,_std::allocator<char>_>::size
                    ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x20));
  *(size_type *)(in_RDI + 0x18) = sVar1;
  pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x20),0);
  *(reference *)(in_RDI + 0x10) = pvVar2;
  if (*(ulong *)(in_RDI + 0x18) < 4) {
    local_45 = 1;
    this_00 = (runtime_error *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_30,"invalid \'mo\' file format - the file is too short",&local_31);
    runtime_error::runtime_error(this_00,in_stack_ffffffffffffff68);
    local_45 = 0;
    __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  local_4c = **(int **)(in_RDI + 0x10);
  if (local_4c == -0x6afbed22) {
    *(undefined1 *)(in_RDI + 0x38) = 1;
  }
  else {
    if (local_4c != -0x21edfb6b) {
      uVar3 = __cxa_allocate_exception(0x30);
      s = (string *)local_71;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_71 + 1),"Invalid file format - invalid magic number",
                 (allocator *)s);
      runtime_error::runtime_error(in_stack_ffffffffffffff70,s);
      __cxa_throw(uVar3,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    *(undefined1 *)(in_RDI + 0x38) = 0;
  }
  return;
}

Assistant:

void load_file(std::vector<char> &data)
                {
                    vdata_.swap(data);
                    file_size_ = vdata_.size();
                    data_ = &vdata_[0];
                    if(file_size_ < 4 )
                        throw booster::runtime_error("invalid 'mo' file format - the file is too short");
                    uint32_t magic=0;
                    memcpy(&magic,data_,4);
                    if(magic == 0x950412de)
                        native_byteorder_ = true;
                    else if(magic == 0xde120495)
                        native_byteorder_ = false;
                    else
                        throw booster::runtime_error("Invalid file format - invalid magic number");
                }